

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Statement * callStatement(void)

{
  int iVar1;
  Expression *pEVar2;
  Statement *in_RDI;
  Statement *s;
  Token local_28;
  
  in_RDI->type = STATEMENT_CALL;
  (in_RDI->field_1).blockStatement.statements = (Statement *)0x0;
  iVar1 = presentLine();
  (in_RDI->field_1).blockStatement.numStatements = iVar1;
  pEVar2 = call();
  (in_RDI->field_1).ifStatement.condition = pEVar2;
  consume(&local_28,TOKEN_NEWLINE,"Expected newline after routine call!");
  return in_RDI;
}

Assistant:

static Statement callStatement(){
    Statement s;
    s.type = STATEMENT_CALL;
    s.callStatement.callee = NULL;
    s.callStatement.line = presentLine();
    s.callStatement.callee = call();
    consume(TOKEN_NEWLINE, "Expected newline after routine call!");
    return s;
}